

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,int16_t v)

{
  int16_t *piVar1;
  uint8_t *d;
  allocator<unsigned_char> local_13;
  int16_t local_12;
  FBXExportProperty *pFStack_10;
  int16_t v_local;
  FBXExportProperty *this_local;
  
  this->type = 'Y';
  local_12 = v;
  pFStack_10 = this;
  std::allocator<unsigned_char>::allocator(&local_13);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data,2,&local_13);
  std::allocator<unsigned_char>::~allocator(&local_13);
  piVar1 = (int16_t *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
  *piVar1 = local_12;
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(int16_t v)
: type('Y')
, data(2) {
    uint8_t* d = data.data();
    (reinterpret_cast<int16_t*>(d))[0] = v;
}